

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRHeaderFromFile(EXRHeader *exr_header,EXRVersion *exr_version,char *filename,char **err)

{
  int iVar1;
  allocator local_81;
  MemoryMappedFile file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if ((exr_version == (EXRVersion *)0x0 || exr_header == (EXRHeader *)0x0) ||
      filename == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_48,"Invalid argument for ParseEXRHeaderFromFile",
               (allocator *)&local_68);
    tinyexr::SetErrorMessage(&local_48,err);
    std::__cxx11::string::~string((string *)&local_48);
    iVar1 = -3;
  }
  else {
    MemoryMappedFile::MemoryMappedFile(&file,filename);
    if (file.data == (uchar *)0x0) {
      std::__cxx11::string::string((string *)&local_68,filename,&local_81);
      std::operator+(&local_48,"Cannot read file ",&local_68);
      tinyexr::SetErrorMessage(&local_48,err);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      iVar1 = -7;
    }
    else {
      iVar1 = ParseEXRHeaderFromMemory(exr_header,exr_version,file.data,file.size,err);
    }
    MemoryMappedFile::~MemoryMappedFile(&file);
  }
  return iVar1;
}

Assistant:

int ParseEXRHeaderFromFile(EXRHeader *exr_header, const EXRVersion *exr_version,
                           const char *filename, const char **err) {
  if (exr_header == NULL || exr_version == NULL || filename == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for ParseEXRHeaderFromFile",
                             err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  MemoryMappedFile file(filename);
  if (!file.valid()) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  return ParseEXRHeaderFromMemory(exr_header, exr_version, file.data, file.size,
                                  err);
}